

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lang_model.cpp
# Opt level: O1

bool __thiscall NJamSpell::TLangModel::Dump(TLangModel *this,string *modelFileName)

{
  char cVar1;
  long local_218;
  ofstream out;
  ios_base local_120 [264];
  
  std::ofstream::ofstream(&local_218,(string *)modelFileName,_S_bin);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 != '\0') {
    std::ostream::write((char *)&local_218,0x13b520);
    std::ostream::write((char *)&local_218,0x13b528);
    (**this->_vptr_TLangModel)(this,&local_218);
    std::ostream::write((char *)&local_218,0x13b520);
  }
  local_218 = _VTT;
  *(undefined8 *)((long)&local_218 + *(long *)(_VTT + -0x18)) = ___throw_bad_array_new_length;
  std::filebuf::~filebuf((filebuf *)&out);
  std::ios_base::~ios_base(local_120);
  return (bool)cVar1;
}

Assistant:

bool TLangModel::Dump(const std::string& modelFileName) const {
    std::ofstream out(modelFileName, std::ios::binary);
    if (!out.is_open()) {
        return false;
    }
    NHandyPack::Dump(out, LANG_MODEL_MAGIC_BYTE);
    NHandyPack::Dump(out, LANG_MODEL_VERSION);
    Dump(out);
    NHandyPack::Dump(out, LANG_MODEL_MAGIC_BYTE);
    return true;
}